

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsStateQueryUtil.hpp
# Opt level: O2

bool __thiscall
deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<float[16]>::verifyValidity
          (StateQueryMemoryWriteGuard<float[16]> *this,TestContext *testCtx)

{
  ostringstream *this_00;
  bool bVar1;
  qpTestResult qVar2;
  char *description;
  MessageBuilder local_190;
  
  bVar1 = isPreguardContaminated(this);
  if (bVar1) {
    local_190.m_log = testCtx->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_190.m_str);
    std::operator<<((ostream *)&local_190.m_str,"// ERROR: Pre-guard value was modified ");
    tcu::MessageBuilder::operator<<(&local_190,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  else {
    bVar1 = isPostguardContaminated(this);
    if (!bVar1) {
      bVar1 = isUndefined(this);
      if (!bVar1) {
        return true;
      }
      local_190.m_log = testCtx->m_log;
      this_00 = &local_190.m_str;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
      std::operator<<((ostream *)this_00,"// ERROR: Get* did not return a value");
      tcu::MessageBuilder::operator<<(&local_190,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_00);
      qVar2 = testCtx->m_testResult;
      description = "Get* did not return a value";
      goto LAB_003b2bdb;
    }
    local_190.m_log = testCtx->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_190.m_str);
    std::operator<<((ostream *)&local_190.m_str,"// ERROR: Post-guard value was modified ");
    tcu::MessageBuilder::operator<<(&local_190,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_190.m_str);
  qVar2 = testCtx->m_testResult;
  description = "Get* did an illegal memory write";
LAB_003b2bdb:
  if ((qVar2 == QP_TEST_RESULT_PASS) || (qVar2 == QP_TEST_RESULT_LAST)) {
    tcu::TestContext::setTestResult(testCtx,QP_TEST_RESULT_FAIL,description);
  }
  return false;
}

Assistant:

bool StateQueryMemoryWriteGuard<T>::verifyValidity (tcu::TestContext& testCtx) const
{
	using tcu::TestLog;

	if (isPreguardContaminated())
	{
		testCtx.getLog() << TestLog::Message << "// ERROR: Pre-guard value was modified " << TestLog::EndMessage;
		if (testCtx.getTestResult() == QP_TEST_RESULT_PASS ||
			testCtx.getTestResult() == QP_TEST_RESULT_LAST)
			testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Get* did an illegal memory write");

		return false;
	}
	else if (isPostguardContaminated())
	{
		testCtx.getLog() << TestLog::Message << "// ERROR: Post-guard value was modified " << TestLog::EndMessage;
		if (testCtx.getTestResult() == QP_TEST_RESULT_PASS ||
			testCtx.getTestResult() == QP_TEST_RESULT_LAST)
			testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Get* did an illegal memory write");

		return false;
	}
	else if (isUndefined())
	{
		testCtx.getLog() << TestLog::Message << "// ERROR: Get* did not return a value" << TestLog::EndMessage;
		if (testCtx.getTestResult() == QP_TEST_RESULT_PASS ||
			testCtx.getTestResult() == QP_TEST_RESULT_LAST)
			testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Get* did not return a value");

		return false;
	}

	return true;
}